

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O2

void aom_lpf_vertical_14_quad_sse2
               (uchar *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0)

{
  uchar *out;
  uchar t_dst [256];
  
  transpose_16x8(s + -8,s + (long)(pitch * 8) + -8,pitch,t_dst,0x10);
  out = t_dst + 0x80;
  transpose_16x8(s,s + pitch * 8,pitch,out,0x10);
  (*aom_lpf_horizontal_14_quad)(out,0x10,_blimit0,_limit0,_thresh0);
  transpose_16x8(t_dst,out,0x10,s + -8,pitch);
  transpose_16x8(t_dst + 8,t_dst + 0x88,0x10,s + (long)(pitch * 8) + -8,pitch);
  return;
}

Assistant:

void aom_lpf_vertical_14_quad_sse2(unsigned char *s, int pitch,
                                   const uint8_t *_blimit0,
                                   const uint8_t *_limit0,
                                   const uint8_t *_thresh0) {
  DECLARE_ALIGNED(16, unsigned char, t_dst[256]);

  // Transpose 16x16
  transpose_16x8(s - 8, s - 8 + 8 * pitch, pitch, t_dst, 16);
  transpose_16x8(s, s + 8 * pitch, pitch, t_dst + 8 * 16, 16);

  // Loop filtering
  aom_lpf_horizontal_14_quad(t_dst + 8 * 16, 16, _blimit0, _limit0, _thresh0);

  // Transpose back
  transpose_16x8(t_dst, t_dst + 8 * 16, 16, s - 8, pitch);
  transpose_16x8(t_dst + 8, t_dst + 8 + 8 * 16, 16, s - 8 + 8 * pitch, pitch);
}